

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O1

int Lf_ManComputeCrossCut(Gia_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  int iVar4;
  ulong uVar5;
  uint *puVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  int *piVar12;
  bool bVar13;
  
  if (p->pMuxes != (uint *)0x0) {
    __assert_fail("p->pMuxes == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaLf.c"
                  ,0xe5,"int Lf_ManComputeCrossCut(Gia_Man_t *)");
  }
  uVar1 = p->nObjs;
  uVar5 = (ulong)uVar1;
  if ((0 < (int)uVar1) && (pGVar3 = p->pObjs, pGVar3 != (Gia_Obj_t *)0x0)) {
    lVar9 = 0;
    do {
      *(undefined4 *)((long)&pGVar3->Value + lVar9) = 0;
      lVar9 = lVar9 + 0xc;
    } while (uVar5 * 0xc != lVar9);
  }
  if ((0 < (int)uVar1) && (p->pObjs != (Gia_Obj_t *)0x0)) {
    puVar6 = &p->pObjs->Value;
    uVar10 = uVar5;
    do {
      uVar11 = *(ulong *)(puVar6 + -2) & 0x1fffffff;
      if (uVar11 != 0x1fffffff && -1 < (int)*(ulong *)(puVar6 + -2)) {
        iVar4 = (int)uVar11;
        uVar8 = *(uint *)((long)puVar6 + (ulong)(uint)(iVar4 * 4) * -3 + -8);
        if ((~uVar8 & 0x1fffffff) != 0 && -1 < (int)uVar8) {
          piVar12 = (int *)((long)puVar6 + (ulong)(uint)(iVar4 << 2) * -3);
          *piVar12 = *piVar12 + 1;
        }
        uVar8 = *(uint *)((long)puVar6 + (ulong)((puVar6[-1] & 0x1fffffff) * 4) * -3 + -8);
        if ((~uVar8 & 0x1fffffff) != 0 && -1 < (int)uVar8) {
          piVar12 = (int *)((long)puVar6 + (ulong)((puVar6[-1] & 0x1fffffff) << 2) * -3);
          *piVar12 = *piVar12 + 1;
        }
      }
      puVar6 = puVar6 + 3;
      uVar10 = uVar10 - 1;
    } while (uVar10 != 0);
  }
  if ((int)uVar1 < 1) {
    bVar13 = true;
    uVar8 = 0;
  }
  else {
    pGVar3 = p->pObjs;
    puVar6 = &pGVar3->Value;
    uVar7 = 0;
    uVar8 = 0;
    uVar10 = uVar5;
    do {
      if (pGVar3 == (Gia_Obj_t *)0x0) {
        uVar8 = 0;
        uVar7 = 0;
        break;
      }
      uVar11 = *(ulong *)(puVar6 + -2) & 0x1fffffff;
      if (uVar11 != 0x1fffffff && -1 < (int)*(ulong *)(puVar6 + -2)) {
        uVar7 = (uVar7 + 1) - (uint)(*puVar6 == 0);
        if ((int)uVar8 <= (int)uVar7) {
          uVar8 = uVar7;
        }
        iVar4 = (int)uVar11;
        uVar2 = *(uint *)((long)puVar6 + (ulong)(uint)(iVar4 * 4) * -3 + -8);
        if ((~uVar2 & 0x1fffffff) != 0 && -1 < (int)uVar2) {
          piVar12 = (int *)((long)puVar6 + (ulong)(uint)(iVar4 << 2) * -3);
          *piVar12 = *piVar12 + -1;
          uVar7 = uVar7 - (*piVar12 == 0);
        }
        uVar2 = *(uint *)((long)puVar6 + (ulong)((puVar6[-1] & 0x1fffffff) * 4) * -3 + -8);
        if ((~uVar2 & 0x1fffffff) != 0 && -1 < (int)uVar2) {
          piVar12 = (int *)((long)puVar6 + (ulong)((puVar6[-1] & 0x1fffffff) << 2) * -3);
          *piVar12 = *piVar12 + -1;
          uVar7 = uVar7 - (*piVar12 == 0);
        }
      }
      puVar6 = puVar6 + 3;
      uVar10 = uVar10 - 1;
    } while (uVar10 != 0);
    bVar13 = uVar7 == 0;
  }
  if (!bVar13) {
    __assert_fail("nCutCur == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaLf.c"
                  ,0xfa,"int Lf_ManComputeCrossCut(Gia_Man_t *)");
  }
  if ((0 < (int)uVar1) && (p->pObjs != (Gia_Obj_t *)0x0)) {
    lVar9 = 0;
    do {
      if (*(int *)((long)&p->pObjs->Value + lVar9) != 0) {
        __assert_fail("pObj->Value == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaLf.c"
                      ,0xfe,"int Lf_ManComputeCrossCut(Gia_Man_t *)");
      }
      lVar9 = lVar9 + 0xc;
    } while (uVar5 * 0xc != lVar9);
  }
  printf("CutMax = %d\n",(ulong)uVar8);
  return uVar8;
}

Assistant:

int Lf_ManComputeCrossCut( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i, nCutMax = 0, nCutCur = 0;
    assert( p->pMuxes == NULL );
    Gia_ManForEachObj( p, pObj, i )
        pObj->Value = 0;
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(Gia_ObjFanin0(pObj)) )
            Gia_ObjFanin0(pObj)->Value++;
        if ( Gia_ObjIsAnd(Gia_ObjFanin1(pObj)) )
            Gia_ObjFanin1(pObj)->Value++;
    }
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( pObj->Value )
            nCutCur++;
        if ( nCutMax < nCutCur )
            nCutMax = nCutCur;
        if ( Gia_ObjIsAnd(Gia_ObjFanin0(pObj)) && --Gia_ObjFanin0(pObj)->Value == 0 )
            nCutCur--;
        if ( Gia_ObjIsAnd(Gia_ObjFanin1(pObj)) && --Gia_ObjFanin1(pObj)->Value == 0 )
            nCutCur--;
    }
    assert( nCutCur == 0 );
    if ( nCutCur )
        printf( "Cutset is not 0\n" );
    Gia_ManForEachObj( p, pObj, i )
        assert( pObj->Value == 0 );
    printf( "CutMax = %d\n", nCutMax );
    return nCutMax;
}